

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  uint uVar1;
  ImGuiWindow *this;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImGuiWindow **ppIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 ref_pos;
  ImRect r_outer;
  ImRect local_48;
  ImVec2 local_30;
  ImRect local_28;
  
  pIVar3 = GImGui;
  local_28 = GetWindowAllowedExtentRect(window);
  uVar1 = window->Flags;
  if ((uVar1 >> 0x1c & 1) == 0) {
    if ((uVar1 >> 0x1a & 1) == 0) {
      if ((uVar1 >> 0x19 & 1) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0x1e80,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
      }
      fVar6 = (pIVar3->Style).MouseCursorScale;
      local_30 = NavCalcPreferredRefPos();
      fVar5 = local_30.x;
      fVar7 = local_30.y;
      if (((pIVar3->NavDisableHighlight == false) && (pIVar3->NavDisableMouseHover == true)) &&
         (((pIVar3->IO).ConfigFlags & 4) == 0)) {
        fVar6 = 16.0;
        fVar8 = 8.0;
      }
      else {
        fVar6 = fVar6 * 24.0;
        fVar8 = fVar6;
      }
      local_48.Min.y = fVar7 + -8.0;
      local_48.Min.x = fVar5 + -16.0;
      local_48.Max.y = fVar8 + fVar7;
      local_48.Max.x = fVar6 + fVar5;
      IVar2 = FindBestWindowPosForPopupEx
                        (&local_30,&window->Size,&window->AutoPosLastDirection,&local_28,&local_48,
                         ImGuiPopupPositionPolicy_Default);
      fVar6 = IVar2.x;
      fVar8 = IVar2.y;
      if (window->AutoPosLastDirection == -1) {
        fVar6 = fVar5 + 2.0;
        fVar8 = fVar7 + 2.0;
      }
      goto LAB_001d2926;
    }
    fVar6 = (window->Pos).x;
    fVar8 = (window->Pos).y;
    local_48.Min.y = fVar8 + -1.0;
    local_48.Min.x = fVar6 + -1.0;
    local_48.Max.y = fVar8 + 1.0;
    local_48.Max.x = fVar6 + 1.0;
  }
  else {
    if (pIVar3->CurrentWindow != window) {
      __assert_fail("g.CurrentWindow == window",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x1e62,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
    }
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[]
                        (&pIVar3->CurrentWindowStack,(pIVar3->CurrentWindowStack).Size + -2);
    this = *ppIVar4;
    if ((this->DC).MenuBarAppending == true) {
      fVar8 = (this->Pos).y;
      fVar6 = ImGuiWindow::TitleBarHeight(this);
      fVar6 = fVar6 + fVar8;
      fVar8 = (this->Pos).y;
      fVar5 = ImGuiWindow::TitleBarHeight(this);
      local_48.Max.y = ImGuiWindow::MenuBarHeight(this);
      local_48.Max.y = local_48.Max.y + fVar5 + fVar8;
      local_48.Max.x = 3.4028235e+38;
      local_48.Min.x = -3.4028235e+38;
    }
    else {
      fVar6 = (pIVar3->Style).ItemInnerSpacing.x;
      fVar8 = (this->Pos).x;
      local_48.Min.x = fVar6 + fVar8;
      local_48.Max.x = ((fVar8 + (this->Size).x) - fVar6) - (this->ScrollbarSizes).x;
      local_48.Max.y = 3.4028235e+38;
      fVar6 = -3.4028235e+38;
    }
    local_48.Min.y = fVar6;
  }
  IVar2 = FindBestWindowPosForPopupEx
                    (&window->Pos,&window->Size,&window->AutoPosLastDirection,&local_28,&local_48,
                     ImGuiPopupPositionPolicy_Default);
  fVar6 = IVar2.x;
  fVar8 = IVar2.y;
LAB_001d2926:
  IVar2.y = fVar8;
  IVar2.x = fVar6;
  return IVar2;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = GetWindowAllowedExtentRect(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        IM_ASSERT(g.CurrentWindow == window);
        ImGuiWindow* parent_window = g.CurrentWindowStack[g.CurrentWindowStack.Size - 2];
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->Pos.y + parent_window->TitleBarHeight(), FLT_MAX, parent_window->Pos.y + parent_window->TitleBarHeight() + parent_window->MenuBarHeight());
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        ImVec2 pos = FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
        if (window->AutoPosLastDirection == ImGuiDir_None)
            pos = ref_pos + ImVec2(2, 2); // If there's not enough room, for tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
        return pos;
    }
    IM_ASSERT(0);
    return window->Pos;
}